

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenFiles(cmSourceGroup *this,string *name)

{
  cmSourceGroupInternals *pcVar1;
  pointer pcVar2;
  bool bVar3;
  cmSourceGroup *this_00;
  
  bVar3 = MatchesFiles(this,name);
  if (!bVar3) {
    pcVar1 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
             .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl;
    this_00 = *(cmSourceGroup **)
               &(pcVar1->GroupChildren).
                super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>;
    pcVar2 = *(pointer *)
              ((long)&(pcVar1->GroupChildren).
                      super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_> + 8);
    do {
      if (this_00 == pcVar2) {
        return (cmSourceGroup *)0x0;
      }
      this = MatchChildrenFiles(this_00,name);
      this_00 = this_00 + 1;
    } while (this == (cmSourceGroup *)0x0);
  }
  return this;
}

Assistant:

const cmSourceGroup* cmSourceGroup::MatchChildrenFiles(
  const std::string& name) const
{
  if (this->MatchesFiles(name)) {
    return this;
  }
  for (const cmSourceGroup& group : this->Internal->GroupChildren) {
    const cmSourceGroup* result = group.MatchChildrenFiles(name);
    if (result) {
      return result;
    }
  }
  return nullptr;
}